

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  float *vertices;
  RayHitK<4> *pRVar39;
  Scene *scene;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar40;
  ulong uVar41;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  UVIdentity<4> mapUV;
  ulong local_2700;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  ulong local_26c8;
  ulong local_26c0;
  ulong local_26b8;
  ulong local_26b0;
  ulong local_26a8;
  ulong local_26a0;
  ulong local_2698;
  StackItemT<embree::NodeRefPtr<8>_> *local_2690;
  RayHitK<4> *local_2688;
  long local_2680;
  Scene *local_2678;
  long local_2670;
  RTCFilterFunctionNArguments args;
  undefined8 local_2638;
  undefined8 uStack_2630;
  undefined1 local_2628 [32];
  undefined1 local_2608 [32];
  undefined1 local_25e8 [32];
  undefined1 local_25c8 [32];
  undefined1 local_25a8 [32];
  undefined1 local_2588 [16];
  undefined1 local_2578 [16];
  undefined1 local_2568 [16];
  UVIdentity<4> *local_2558;
  byte local_2550;
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  float local_24f8 [4];
  undefined1 local_24e8 [16];
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  RTCHitN local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined4 local_2488;
  undefined4 uStack_2484;
  undefined4 uStack_2480;
  undefined4 uStack_247c;
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  uint local_2458;
  uint uStack_2454;
  uint uStack_2450;
  uint uStack_244c;
  uint uStack_2448;
  uint uStack_2444;
  uint uStack_2440;
  uint uStack_243c;
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2690 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_25a8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar90 = ZEXT3264(local_25a8);
  local_25c8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar91 = ZEXT3264(local_25c8);
  local_25e8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar92 = ZEXT3264(local_25e8);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2608 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 0.99999964)));
  auVar93 = ZEXT3264(local_2608);
  local_2628 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 0.99999964)));
  auVar94 = ZEXT3264(local_2628);
  fVar14 = fVar4 * 0.99999964;
  local_23b8._4_4_ = fVar14;
  local_23b8._0_4_ = fVar14;
  local_23b8._8_4_ = fVar14;
  local_23b8._12_4_ = fVar14;
  local_23b8._16_4_ = fVar14;
  local_23b8._20_4_ = fVar14;
  local_23b8._24_4_ = fVar14;
  local_23b8._28_4_ = fVar14;
  auVar80 = ZEXT3264(local_23b8);
  fVar2 = fVar2 * 1.0000004;
  local_23d8._4_4_ = fVar2;
  local_23d8._0_4_ = fVar2;
  local_23d8._8_4_ = fVar2;
  local_23d8._12_4_ = fVar2;
  local_23d8._16_4_ = fVar2;
  local_23d8._20_4_ = fVar2;
  local_23d8._24_4_ = fVar2;
  local_23d8._28_4_ = fVar2;
  auVar82 = ZEXT3264(local_23d8);
  fVar3 = fVar3 * 1.0000004;
  local_23f8._4_4_ = fVar3;
  local_23f8._0_4_ = fVar3;
  local_23f8._8_4_ = fVar3;
  local_23f8._12_4_ = fVar3;
  local_23f8._16_4_ = fVar3;
  local_23f8._20_4_ = fVar3;
  local_23f8._24_4_ = fVar3;
  local_23f8._28_4_ = fVar3;
  auVar84 = ZEXT3264(local_23f8);
  fVar4 = fVar4 * 1.0000004;
  local_2418._4_4_ = fVar4;
  local_2418._0_4_ = fVar4;
  local_2418._8_4_ = fVar4;
  local_2418._12_4_ = fVar4;
  local_2418._16_4_ = fVar4;
  local_2418._20_4_ = fVar4;
  local_2418._24_4_ = fVar4;
  local_2418._28_4_ = fVar4;
  auVar85 = ZEXT3264(local_2418);
  local_26a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_26a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_26b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_26b8 = local_26a0 ^ 0x20;
  local_26c0 = local_26a8 ^ 0x20;
  local_26c8 = local_26b0 ^ 0x20;
  iVar23 = (tray->tnear).field_0.i[k];
  local_2438._4_4_ = iVar23;
  local_2438._0_4_ = iVar23;
  local_2438._8_4_ = iVar23;
  local_2438._12_4_ = iVar23;
  local_2438._16_4_ = iVar23;
  local_2438._20_4_ = iVar23;
  local_2438._24_4_ = iVar23;
  local_2438._28_4_ = iVar23;
  auVar86 = ZEXT3264(local_2438);
  iVar23 = (tray->tfar).field_0.i[k];
  auVar73 = ZEXT3264(CONCAT428(iVar23,CONCAT424(iVar23,CONCAT420(iVar23,CONCAT416(iVar23,CONCAT412(
                                                  iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23)))))
                                               )));
  local_24e8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar72 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar87 = ZEXT3264(auVar72);
  auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  uVar31 = local_26b8;
  uVar30 = local_26a0;
  uVar41 = local_26a8;
  uVar32 = local_26b0;
  uVar33 = local_26c8;
  uVar34 = local_26c0;
  local_2688 = ray;
  do {
    do {
      do {
        if (local_2690 == stack) {
          return;
        }
        pSVar22 = local_2690 + -1;
        local_2690 = local_2690 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar22->dist);
      local_2700 = (local_2690->ptr).ptr;
      do {
        auVar72 = auVar86._0_32_;
        if ((local_2700 & 8) == 0) {
          uVar24 = local_2700 & 0xfffffffffffffff0;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar74._4_4_ = uVar5;
          auVar74._0_4_ = uVar5;
          auVar74._8_4_ = uVar5;
          auVar74._12_4_ = uVar5;
          auVar74._16_4_ = uVar5;
          auVar74._20_4_ = uVar5;
          auVar74._24_4_ = uVar5;
          auVar74._28_4_ = uVar5;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar30),auVar74,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar30));
          auVar64 = vsubps_avx512vl(ZEXT1632(auVar53),auVar90._0_32_);
          auVar64 = vmulps_avx512vl(auVar93._0_32_,auVar64);
          auVar64 = vmaxps_avx(auVar72,auVar64);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar41),auVar74,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar41));
          auVar65 = vsubps_avx512vl(ZEXT1632(auVar53),auVar91._0_32_);
          auVar66 = vmulps_avx512vl(auVar94._0_32_,auVar65);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar32),auVar74,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar32));
          auVar67 = vsubps_avx512vl(ZEXT1632(auVar53),auVar92._0_32_);
          auVar65._4_4_ = auVar80._4_4_ * auVar67._4_4_;
          auVar65._0_4_ = auVar80._0_4_ * auVar67._0_4_;
          auVar65._8_4_ = auVar80._8_4_ * auVar67._8_4_;
          auVar65._12_4_ = auVar80._12_4_ * auVar67._12_4_;
          auVar65._16_4_ = auVar80._16_4_ * auVar67._16_4_;
          auVar65._20_4_ = auVar80._20_4_ * auVar67._20_4_;
          auVar65._24_4_ = auVar80._24_4_ * auVar67._24_4_;
          auVar65._28_4_ = auVar67._28_4_;
          auVar65 = vmaxps_avx(auVar66,auVar65);
          auVar68 = vmaxps_avx512vl(auVar64,auVar65);
          in_ZMM16 = ZEXT3264(auVar68);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar31),auVar74,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar31));
          auVar64 = vsubps_avx512vl(ZEXT1632(auVar53),auVar90._0_32_);
          auVar66._4_4_ = auVar82._4_4_ * auVar64._4_4_;
          auVar66._0_4_ = auVar82._0_4_ * auVar64._0_4_;
          auVar66._8_4_ = auVar82._8_4_ * auVar64._8_4_;
          auVar66._12_4_ = auVar82._12_4_ * auVar64._12_4_;
          auVar66._16_4_ = auVar82._16_4_ * auVar64._16_4_;
          auVar66._20_4_ = auVar82._20_4_ * auVar64._20_4_;
          auVar66._24_4_ = auVar82._24_4_ * auVar64._24_4_;
          auVar66._28_4_ = auVar64._28_4_;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar34),auVar74,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar34));
          auVar65 = vsubps_avx512vl(ZEXT1632(auVar53),auVar91._0_32_);
          auVar64._4_4_ = auVar84._4_4_ * auVar65._4_4_;
          auVar64._0_4_ = auVar84._0_4_ * auVar65._0_4_;
          auVar64._8_4_ = auVar84._8_4_ * auVar65._8_4_;
          auVar64._12_4_ = auVar84._12_4_ * auVar65._12_4_;
          auVar64._16_4_ = auVar84._16_4_ * auVar65._16_4_;
          auVar64._20_4_ = auVar84._20_4_ * auVar65._20_4_;
          auVar64._24_4_ = auVar84._24_4_ * auVar65._24_4_;
          auVar64._28_4_ = auVar65._28_4_;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar33),auVar74,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar33));
          auVar65 = vsubps_avx512vl(ZEXT1632(auVar53),auVar92._0_32_);
          auVar67._4_4_ = auVar85._4_4_ * auVar65._4_4_;
          auVar67._0_4_ = auVar85._0_4_ * auVar65._0_4_;
          auVar67._8_4_ = auVar85._8_4_ * auVar65._8_4_;
          auVar67._12_4_ = auVar85._12_4_ * auVar65._12_4_;
          auVar67._16_4_ = auVar85._16_4_ * auVar65._16_4_;
          auVar67._20_4_ = auVar85._20_4_ * auVar65._20_4_;
          auVar67._24_4_ = auVar85._24_4_ * auVar65._24_4_;
          auVar67._28_4_ = auVar65._28_4_;
          auVar64 = vminps_avx(auVar64,auVar67);
          auVar65 = vminps_avx(auVar73._0_32_,auVar66);
          auVar64 = vminps_avx(auVar65,auVar64);
          if (((uint)local_2700 & 7) == 6) {
            uVar17 = vcmpps_avx512vl(auVar68,auVar64,2);
            uVar16 = vcmpps_avx512vl(auVar74,*(undefined1 (*) [32])(uVar24 + 0x1c0),0xd);
            uVar18 = vcmpps_avx512vl(auVar74,*(undefined1 (*) [32])(uVar24 + 0x1e0),1);
            bVar26 = (byte)uVar17 & (byte)uVar16 & (byte)uVar18;
          }
          else {
            uVar17 = vcmpps_avx512vl(auVar68,auVar64,2);
            bVar26 = (byte)uVar17;
          }
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),(uint)bVar26);
        }
        if ((local_2700 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar23 = 4;
          }
          else {
            auVar64 = *(undefined1 (*) [32])(local_2700 & 0xfffffffffffffff0);
            auVar65 = ((undefined1 (*) [32])(local_2700 & 0xfffffffffffffff0))[1];
            auVar74 = auVar87._0_32_;
            auVar88 = auVar89._0_32_;
            auVar71 = in_ZMM16._0_32_;
            auVar66 = vpternlogd_avx512vl(auVar74,auVar71,auVar88,0xf8);
            uVar24 = unaff_RBP & 0xffffffff;
            auVar67 = vpcompressd_avx512vl(auVar66);
            bVar13 = (bool)((byte)uVar24 & 1);
            auVar68._0_4_ = (uint)bVar13 * auVar67._0_4_ | (uint)!bVar13 * auVar66._0_4_;
            bVar13 = (bool)((byte)(uVar24 >> 1) & 1);
            auVar68._4_4_ = (uint)bVar13 * auVar67._4_4_ | (uint)!bVar13 * auVar66._4_4_;
            bVar13 = (bool)((byte)(uVar24 >> 2) & 1);
            auVar68._8_4_ = (uint)bVar13 * auVar67._8_4_ | (uint)!bVar13 * auVar66._8_4_;
            bVar13 = (bool)((byte)(uVar24 >> 3) & 1);
            auVar68._12_4_ = (uint)bVar13 * auVar67._12_4_ | (uint)!bVar13 * auVar66._12_4_;
            bVar13 = (bool)((byte)(uVar24 >> 4) & 1);
            auVar68._16_4_ = (uint)bVar13 * auVar67._16_4_ | (uint)!bVar13 * auVar66._16_4_;
            bVar13 = (bool)((byte)(uVar24 >> 5) & 1);
            auVar68._20_4_ = (uint)bVar13 * auVar67._20_4_ | (uint)!bVar13 * auVar66._20_4_;
            bVar13 = (bool)((byte)(uVar24 >> 6) & 1);
            auVar68._24_4_ = (uint)bVar13 * auVar67._24_4_ | (uint)!bVar13 * auVar66._24_4_;
            bVar13 = (bool)((byte)(uVar24 >> 7) & 1);
            auVar68._28_4_ = (uint)bVar13 * auVar67._28_4_ | (uint)!bVar13 * auVar66._28_4_;
            auVar66 = vpermt2q_avx512vl(auVar64,auVar68,auVar65);
            local_2700 = auVar66._0_8_;
            iVar23 = 0;
            uVar24 = unaff_RBP - 1 & unaff_RBP;
            if (uVar24 != 0) {
              auVar66 = vpshufd_avx2(auVar68,0x55);
              vpermt2q_avx512vl(auVar64,auVar66,auVar65);
              auVar67 = vpminsd_avx2(auVar68,auVar66);
              auVar66 = vpmaxsd_avx2(auVar68,auVar66);
              uVar24 = uVar24 - 1 & uVar24;
              if (uVar24 == 0) {
                auVar72 = vpermi2q_avx512vl(auVar67,auVar64,auVar65);
                local_2700 = auVar72._0_8_;
                auVar72 = vpermt2q_avx512vl(auVar64,auVar66,auVar65);
                (local_2690->ptr).ptr = auVar72._0_8_;
                auVar72 = vpermd_avx512vl(auVar66,auVar71);
                local_2690->dist = auVar72._0_4_;
                local_2690 = local_2690 + 1;
              }
              else {
                auVar15 = vpshufd_avx2(auVar68,0xaa);
                vpermt2q_avx512vl(auVar64,auVar15,auVar65);
                auVar77 = vpminsd_avx2(auVar67,auVar15);
                auVar67 = vpmaxsd_avx2(auVar67,auVar15);
                auVar15 = vpminsd_avx2(auVar66,auVar67);
                auVar66 = vpmaxsd_avx2(auVar66,auVar67);
                uVar24 = uVar24 - 1 & uVar24;
                if (uVar24 == 0) {
                  auVar72 = vpermi2q_avx512vl(auVar77,auVar64,auVar65);
                  local_2700 = auVar72._0_8_;
                  auVar72 = vpermt2q_avx512vl(auVar64,auVar66,auVar65);
                  (local_2690->ptr).ptr = auVar72._0_8_;
                  auVar72 = vpermd_avx512vl(auVar66,auVar71);
                  local_2690->dist = auVar72._0_4_;
                  auVar72 = vpermt2q_avx512vl(auVar64,auVar15,auVar65);
                  local_2690[1].ptr.ptr = auVar72._0_8_;
                  auVar72 = vpermd_avx512vl(auVar15,auVar71);
                  local_2690[1].dist = auVar72._0_4_;
                  local_2690 = local_2690 + 2;
                }
                else {
                  auVar69 = vmovdqa64_avx512vl(auVar71);
                  auVar67 = vpshufd_avx2(auVar68,0xff);
                  vpermt2q_avx512vl(auVar64,auVar67,auVar65);
                  auVar71 = vpminsd_avx2(auVar77,auVar67);
                  auVar67 = vpmaxsd_avx2(auVar77,auVar67);
                  auVar77 = vpminsd_avx2(auVar15,auVar67);
                  auVar67 = vpmaxsd_avx2(auVar15,auVar67);
                  auVar15 = vpminsd_avx2(auVar66,auVar67);
                  auVar66 = vpmaxsd_avx2(auVar66,auVar67);
                  uVar24 = uVar24 - 1 & uVar24;
                  if (uVar24 == 0) {
                    auVar67 = vpermi2q_avx512vl(auVar71,auVar64,auVar65);
                    local_2700 = auVar67._0_8_;
                    auVar67 = vpermt2q_avx512vl(auVar64,auVar66,auVar65);
                    (local_2690->ptr).ptr = auVar67._0_8_;
                    auVar67 = vmovdqa64_avx512vl(auVar69);
                    in_ZMM16 = ZEXT3264(auVar67);
                    auVar66 = vpermd_avx512vl(auVar66,auVar69);
                    local_2690->dist = auVar66._0_4_;
                    auVar66 = vpermt2q_avx512vl(auVar64,auVar15,auVar65);
                    local_2690[1].ptr.ptr = auVar66._0_8_;
                    auVar66 = vpermd_avx512vl(auVar15,auVar69);
                    local_2690[1].dist = auVar66._0_4_;
                    auVar64 = vpermt2q_avx512vl(auVar64,auVar77,auVar65);
                    local_2690[2].ptr.ptr = auVar64._0_8_;
                    auVar64 = vpermd_avx512vl(auVar77,auVar69);
                    local_2690[2].dist = auVar64._0_4_;
                    local_2690 = local_2690 + 3;
                    auVar90 = ZEXT3264(local_25a8);
                    auVar91 = ZEXT3264(local_25c8);
                    auVar92 = ZEXT3264(local_25e8);
                    auVar93 = ZEXT3264(local_2608);
                    auVar94 = ZEXT3264(local_2628);
                    auVar80 = ZEXT3264(auVar80._0_32_);
                    auVar82 = ZEXT3264(auVar82._0_32_);
                    auVar84 = ZEXT3264(auVar84._0_32_);
                    auVar85 = ZEXT3264(auVar85._0_32_);
                    auVar86 = ZEXT3264(auVar72);
                    auVar87 = ZEXT3264(auVar74);
                    auVar89 = ZEXT3264(auVar88);
                  }
                  else {
                    auVar70 = valignd_avx512vl(auVar68,auVar68,3);
                    auVar67 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar68 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                   CONCAT48(0x80000000,
                                                                            0x8000000080000000))),
                                                auVar67,auVar71);
                    auVar67 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar68 = vpermt2d_avx512vl(auVar68,auVar67,auVar77);
                    auVar68 = vpermt2d_avx512vl(auVar68,auVar67,auVar15);
                    auVar67 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar66 = vpermt2d_avx512vl(auVar68,auVar67,auVar66);
                    auVar86 = ZEXT3264(auVar66);
                    uVar28 = uVar24;
                    do {
                      auVar67 = auVar86._0_32_;
                      auVar77._8_4_ = 1;
                      auVar77._0_8_ = 0x100000001;
                      auVar77._12_4_ = 1;
                      auVar77._16_4_ = 1;
                      auVar77._20_4_ = 1;
                      auVar77._24_4_ = 1;
                      auVar77._28_4_ = 1;
                      auVar66 = vpermd_avx2(auVar77,auVar70);
                      auVar70 = valignd_avx512vl(auVar70,auVar70,1);
                      vpermt2q_avx512vl(auVar64,auVar70,auVar65);
                      uVar28 = uVar28 - 1 & uVar28;
                      uVar17 = vpcmpd_avx512vl(auVar66,auVar67,5);
                      auVar66 = vpmaxsd_avx2(auVar66,auVar67);
                      bVar26 = (byte)uVar17 << 1;
                      auVar67 = valignd_avx512vl(auVar67,auVar67,7);
                      bVar13 = (bool)((byte)uVar17 & 1);
                      auVar71._4_4_ = (uint)bVar13 * auVar67._4_4_ | (uint)!bVar13 * auVar66._4_4_;
                      auVar71._0_4_ = auVar66._0_4_;
                      bVar13 = (bool)(bVar26 >> 2 & 1);
                      auVar71._8_4_ = (uint)bVar13 * auVar67._8_4_ | (uint)!bVar13 * auVar66._8_4_;
                      bVar13 = (bool)(bVar26 >> 3 & 1);
                      auVar71._12_4_ =
                           (uint)bVar13 * auVar67._12_4_ | (uint)!bVar13 * auVar66._12_4_;
                      bVar13 = (bool)(bVar26 >> 4 & 1);
                      auVar71._16_4_ =
                           (uint)bVar13 * auVar67._16_4_ | (uint)!bVar13 * auVar66._16_4_;
                      bVar13 = (bool)(bVar26 >> 5 & 1);
                      auVar71._20_4_ =
                           (uint)bVar13 * auVar67._20_4_ | (uint)!bVar13 * auVar66._20_4_;
                      bVar13 = (bool)(bVar26 >> 6 & 1);
                      auVar71._24_4_ =
                           (uint)bVar13 * auVar67._24_4_ | (uint)!bVar13 * auVar66._24_4_;
                      auVar71._28_4_ =
                           (uint)(bVar26 >> 7) * auVar67._28_4_ |
                           (uint)!(bool)(bVar26 >> 7) * auVar66._28_4_;
                      auVar86 = ZEXT3264(auVar71);
                    } while (uVar28 != 0);
                    lVar27 = POPCOUNT(uVar24) + 3;
                    do {
                      auVar66 = vpermi2q_avx512vl(auVar71,auVar64,auVar65);
                      (local_2690->ptr).ptr = auVar66._0_8_;
                      auVar67 = auVar86._0_32_;
                      auVar66 = vpermd_avx512vl(auVar67,auVar69);
                      local_2690->dist = auVar66._0_4_;
                      auVar71 = valignd_avx512vl(auVar67,auVar67,1);
                      local_2690 = local_2690 + 1;
                      auVar86 = ZEXT3264(auVar71);
                      lVar27 = lVar27 + -1;
                    } while (lVar27 != 0);
                    auVar64 = vpermt2q_avx512vl(auVar64,auVar71,auVar65);
                    local_2700 = auVar64._0_8_;
                    auVar90 = ZEXT3264(local_25a8);
                    auVar91 = ZEXT3264(local_25c8);
                    auVar92 = ZEXT3264(local_25e8);
                    auVar93 = ZEXT3264(local_2608);
                    auVar94 = ZEXT3264(local_2628);
                    auVar80 = ZEXT3264(auVar80._0_32_);
                    auVar82 = ZEXT3264(auVar82._0_32_);
                    auVar84 = ZEXT3264(auVar84._0_32_);
                    auVar85 = ZEXT3264(auVar85._0_32_);
                    auVar86 = ZEXT3264(auVar72);
                    auVar87 = ZEXT3264(auVar74);
                    auVar89 = ZEXT3264(auVar88);
                    auVar72 = vmovdqa64_avx512vl(auVar69);
                    in_ZMM16 = ZEXT3264(auVar72);
                  }
                }
              }
            }
          }
        }
        else {
          iVar23 = 6;
        }
      } while (iVar23 == 0);
    } while (iVar23 != 6);
    local_2398 = vmovdqu64_avx512vl(in_ZMM16._0_32_);
    local_2680 = (ulong)((uint)local_2700 & 0xf) - 8;
    local_2698 = unaff_RBP;
    if (local_2680 != 0) {
      uVar31 = local_2700 & 0xfffffffffffffff0;
      local_2670 = 0;
      pRVar39 = ray;
      do {
        ray = local_2688;
        lVar25 = local_2670 * 0x50;
        pSVar8 = context->scene;
        pGVar9 = (pSVar8->geometries).items[*(uint *)(uVar31 + 0x30 + lVar25)].ptr;
        fVar2 = (pGVar9->time_range).lower;
        fVar2 = pGVar9->fnumTimeSegments *
                ((*(float *)(pRVar39 + k * 4 + 0x70) - fVar2) / ((pGVar9->time_range).upper - fVar2)
                );
        auVar53 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
        auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
        auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar53);
        lVar29 = (long)(int)auVar78._0_4_ * 0x38;
        uVar24 = (ulong)*(uint *)(uVar31 + 4 + lVar25);
        lVar27 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar29);
        lVar29 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar29);
        auVar53 = *(undefined1 (*) [16])(lVar27 + (ulong)*(uint *)(uVar31 + lVar25) * 4);
        uVar33 = (ulong)*(uint *)(uVar31 + 0x10 + lVar25);
        auVar62 = *(undefined1 (*) [16])(lVar27 + uVar33 * 4);
        uVar34 = (ulong)*(uint *)(uVar31 + 0x20 + lVar25);
        auVar63 = *(undefined1 (*) [16])(lVar27 + uVar34 * 4);
        auVar42 = *(undefined1 (*) [16])(lVar27 + uVar24 * 4);
        uVar28 = (ulong)*(uint *)(uVar31 + 0x14 + lVar25);
        auVar57 = *(undefined1 (*) [16])(lVar27 + uVar28 * 4);
        uVar35 = (ulong)*(uint *)(uVar31 + 0x24 + lVar25);
        auVar58 = *(undefined1 (*) [16])(lVar27 + uVar35 * 4);
        uVar36 = (ulong)*(uint *)(uVar31 + 8 + lVar25);
        auVar43 = *(undefined1 (*) [16])(lVar27 + uVar36 * 4);
        uVar41 = (ulong)*(uint *)(uVar31 + 0x18 + lVar25);
        auVar45 = *(undefined1 (*) [16])(lVar27 + uVar41 * 4);
        uVar37 = (ulong)*(uint *)(uVar31 + 0x28 + lVar25);
        auVar56 = *(undefined1 (*) [16])(lVar27 + uVar37 * 4);
        uVar38 = (ulong)*(uint *)(uVar31 + 0xc + lVar25);
        auVar54 = *(undefined1 (*) [16])(lVar27 + uVar38 * 4);
        uVar32 = (ulong)*(uint *)(uVar31 + 0x1c + lVar25);
        auVar55 = *(undefined1 (*) [16])(lVar27 + uVar32 * 4);
        uVar30 = (ulong)*(uint *)(uVar31 + 0x2c + lVar25);
        auVar44 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
        auVar46 = *(undefined1 (*) [16])(lVar29 + (ulong)*(uint *)(uVar31 + lVar25) * 4);
        auVar47 = *(undefined1 (*) [16])(lVar29 + uVar33 * 4);
        auVar50 = *(undefined1 (*) [16])(lVar29 + uVar34 * 4);
        auVar48 = *(undefined1 (*) [16])(lVar29 + uVar24 * 4);
        auVar49 = *(undefined1 (*) [16])(lVar29 + uVar28 * 4);
        auVar51 = *(undefined1 (*) [16])(lVar29 + uVar35 * 4);
        auVar52 = *(undefined1 (*) [16])(lVar29 + uVar36 * 4);
        auVar59 = *(undefined1 (*) [16])(lVar29 + uVar41 * 4);
        auVar60 = *(undefined1 (*) [16])(lVar29 + uVar37 * 4);
        auVar61 = *(undefined1 (*) [16])(lVar29 + uVar38 * 4);
        auVar75 = *(undefined1 (*) [16])(lVar29 + uVar32 * 4);
        auVar76 = *(undefined1 (*) [16])(lVar29 + uVar30 * 4);
        puVar1 = (undefined8 *)(uVar31 + 0x30 + lVar25);
        local_24d8 = *puVar1;
        uStack_24d0 = puVar1[1];
        puVar1 = (undefined8 *)(uVar31 + 0x40 + lVar25);
        auVar79 = vunpcklps_avx(auVar53,auVar43);
        auVar53 = vunpckhps_avx(auVar53,auVar43);
        auVar43 = vunpcklps_avx(auVar42,auVar54);
        auVar42 = vunpckhps_avx(auVar42,auVar54);
        auVar54 = vunpcklps_avx(auVar53,auVar42);
        auVar81 = vunpcklps_avx(auVar79,auVar43);
        auVar53 = vunpckhps_avx(auVar79,auVar43);
        auVar43 = vunpcklps_avx(auVar62,auVar45);
        auVar62 = vunpckhps_avx(auVar62,auVar45);
        auVar45 = vunpcklps_avx(auVar57,auVar55);
        auVar42 = vunpckhps_avx(auVar57,auVar55);
        auVar57 = vunpcklps_avx(auVar62,auVar42);
        auVar55 = vunpcklps_avx(auVar43,auVar45);
        auVar62 = vunpckhps_avx(auVar43,auVar45);
        auVar43 = vunpcklps_avx(auVar63,auVar56);
        auVar63 = vunpckhps_avx(auVar63,auVar56);
        auVar45 = vunpcklps_avx(auVar58,auVar44);
        auVar42 = vunpckhps_avx(auVar58,auVar44);
        auVar58 = vunpcklps_avx(auVar63,auVar42);
        auVar56 = vunpcklps_avx(auVar43,auVar45);
        auVar63 = vunpckhps_avx(auVar43,auVar45);
        auVar42 = vunpcklps_avx512vl(auVar46,auVar52);
        auVar43 = vunpckhps_avx512vl(auVar46,auVar52);
        auVar44 = vunpcklps_avx512vl(auVar48,auVar61);
        auVar45 = vunpckhps_avx512vl(auVar48,auVar61);
        auVar43 = vunpcklps_avx(auVar43,auVar45);
        auVar45 = vunpcklps_avx(auVar42,auVar44);
        auVar42 = vunpckhps_avx(auVar42,auVar44);
        auVar44 = vunpcklps_avx512vl(auVar47,auVar59);
        auVar46 = vunpckhps_avx512vl(auVar47,auVar59);
        auVar47 = vunpcklps_avx512vl(auVar49,auVar75);
        auVar48 = vunpckhps_avx512vl(auVar49,auVar75);
        auVar46 = vunpcklps_avx512vl(auVar46,auVar48);
        auVar48 = vunpcklps_avx512vl(auVar44,auVar47);
        auVar47 = vunpckhps_avx512vl(auVar44,auVar47);
        auVar49 = vunpcklps_avx512vl(auVar50,auVar60);
        auVar44 = vunpckhps_avx512vl(auVar50,auVar60);
        auVar50 = vunpcklps_avx512vl(auVar51,auVar76);
        auVar51 = vunpckhps_avx512vl(auVar51,auVar76);
        auVar44 = vunpcklps_avx(auVar44,auVar51);
        auVar51 = vunpcklps_avx512vl(auVar49,auVar50);
        auVar50 = vunpckhps_avx512vl(auVar49,auVar50);
        auVar52 = ZEXT416((uint)(fVar2 - auVar78._0_4_));
        auVar49 = vbroadcastss_avx512vl(auVar52);
        auVar52 = vsubss_avx512f(ZEXT416(0x3f800000),auVar52);
        auVar59._0_4_ = auVar52._0_4_;
        auVar59._4_4_ = auVar59._0_4_;
        auVar59._8_4_ = auVar59._0_4_;
        auVar59._12_4_ = auVar59._0_4_;
        auVar45 = vmulps_avx512vl(auVar49,auVar45);
        auVar52 = vmulps_avx512vl(auVar49,auVar42);
        auVar43 = vmulps_avx512vl(auVar49,auVar43);
        auVar42 = vfmadd231ps_fma(auVar45,auVar59,auVar81);
        auVar52 = vfmadd231ps_avx512vl(auVar52,auVar59,auVar53);
        auVar43 = vfmadd231ps_fma(auVar43,auVar59,auVar54);
        auVar53 = vmulps_avx512vl(auVar49,auVar48);
        auVar54 = vmulps_avx512vl(auVar49,auVar47);
        auVar46 = vmulps_avx512vl(auVar49,auVar46);
        auVar45 = vfmadd231ps_fma(auVar53,auVar59,auVar55);
        auVar62 = vfmadd231ps_fma(auVar54,auVar59,auVar62);
        auVar54 = vfmadd231ps_avx512vl(auVar46,auVar59,auVar57);
        auVar53 = vmulps_avx512vl(auVar49,auVar51);
        auVar55 = vmulps_avx512vl(auVar49,auVar50);
        auVar44 = vmulps_avx512vl(auVar49,auVar44);
        auVar57 = vfmadd231ps_fma(auVar53,auVar59,auVar56);
        local_2638 = *puVar1;
        uStack_2630 = puVar1[1];
        auVar63 = vfmadd231ps_fma(auVar55,auVar59,auVar63);
        local_2558 = &mapUV;
        uVar5 = *(undefined4 *)(local_2688 + k * 4);
        auVar47._4_4_ = uVar5;
        auVar47._0_4_ = uVar5;
        auVar47._8_4_ = uVar5;
        auVar47._12_4_ = uVar5;
        auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_2688 + k * 4 + 0x10)));
        auVar55 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_2688 + k * 4 + 0x20)));
        uVar5 = *(undefined4 *)(local_2688 + k * 4 + 0x40);
        auVar78._4_4_ = uVar5;
        auVar78._0_4_ = uVar5;
        auVar78._8_4_ = uVar5;
        auVar78._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(local_2688 + k * 4 + 0x50);
        auVar79._4_4_ = uVar5;
        auVar79._0_4_ = uVar5;
        auVar79._8_4_ = uVar5;
        auVar79._12_4_ = uVar5;
        auVar58 = vfmadd231ps_fma(auVar44,auVar59,auVar58);
        fVar2 = *(float *)(local_2688 + k * 4 + 0x60);
        auVar83._4_4_ = fVar2;
        auVar83._0_4_ = fVar2;
        auVar83._8_4_ = fVar2;
        auVar83._12_4_ = fVar2;
        auVar53 = vsubps_avx(auVar42,auVar47);
        auVar44 = vsubps_avx512vl(auVar52,auVar56);
        auVar43 = vsubps_avx512vl(auVar43,auVar55);
        auVar45 = vsubps_avx512vl(auVar45,auVar47);
        auVar46 = vsubps_avx512vl(auVar62,auVar56);
        auVar54 = vsubps_avx512vl(auVar54,auVar55);
        auVar62 = vsubps_avx(auVar57,auVar47);
        auVar57 = vsubps_avx512vl(auVar63,auVar56);
        auVar58 = vsubps_avx512vl(auVar58,auVar55);
        auVar63 = vsubps_avx(auVar62,auVar53);
        auVar56 = vsubps_avx512vl(auVar57,auVar44);
        auVar55 = vsubps_avx512vl(auVar58,auVar43);
        auVar47 = vsubps_avx512vl(auVar53,auVar45);
        auVar50 = vsubps_avx512vl(auVar44,auVar46);
        auVar48 = vsubps_avx512vl(auVar43,auVar54);
        auVar49 = vsubps_avx512vl(auVar45,auVar62);
        auVar51 = vsubps_avx512vl(auVar46,auVar57);
        auVar52 = vsubps_avx512vl(auVar54,auVar58);
        auVar61._0_4_ = auVar62._0_4_ + auVar53._0_4_;
        auVar61._4_4_ = auVar62._4_4_ + auVar53._4_4_;
        auVar61._8_4_ = auVar62._8_4_ + auVar53._8_4_;
        auVar61._12_4_ = auVar62._12_4_ + auVar53._12_4_;
        auVar42 = vaddps_avx512vl(auVar57,auVar44);
        auVar59 = vaddps_avx512vl(auVar58,auVar43);
        auVar60 = vmulps_avx512vl(auVar42,auVar55);
        auVar60 = vfmsub231ps_avx512vl(auVar60,auVar56,auVar59);
        auVar59 = vmulps_avx512vl(auVar59,auVar63);
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar55,auVar61);
        auVar75._0_4_ = auVar56._0_4_ * auVar61._0_4_;
        auVar75._4_4_ = auVar56._4_4_ * auVar61._4_4_;
        auVar75._8_4_ = auVar56._8_4_ * auVar61._8_4_;
        auVar75._12_4_ = auVar56._12_4_ * auVar61._12_4_;
        auVar42 = vfmsub231ps_fma(auVar75,auVar63,auVar42);
        auVar76._0_4_ = fVar2 * auVar42._0_4_;
        auVar76._4_4_ = fVar2 * auVar42._4_4_;
        auVar76._8_4_ = fVar2 * auVar42._8_4_;
        auVar76._12_4_ = fVar2 * auVar42._12_4_;
        auVar42 = vfmadd231ps_avx512vl(auVar76,auVar79,auVar59);
        local_2588 = vfmadd231ps_avx512vl(auVar42,auVar78,auVar60);
        auVar42 = vaddps_avx512vl(auVar53,auVar45);
        auVar59 = vaddps_avx512vl(auVar44,auVar46);
        auVar60 = vaddps_avx512vl(auVar43,auVar54);
        auVar61 = vmulps_avx512vl(auVar59,auVar48);
        auVar61 = vfmsub231ps_avx512vl(auVar61,auVar50,auVar60);
        auVar60 = vmulps_avx512vl(auVar60,auVar47);
        auVar60 = vfmsub231ps_avx512vl(auVar60,auVar48,auVar42);
        auVar42 = vmulps_avx512vl(auVar42,auVar50);
        auVar42 = vfmsub231ps_avx512vl(auVar42,auVar47,auVar59);
        auVar81._0_4_ = auVar42._0_4_ * fVar2;
        auVar81._4_4_ = auVar42._4_4_ * fVar2;
        auVar81._8_4_ = auVar42._8_4_ * fVar2;
        auVar81._12_4_ = auVar42._12_4_ * fVar2;
        auVar42 = vfmadd231ps_avx512vl(auVar81,auVar79,auVar60);
        local_2578 = vfmadd231ps_avx512vl(auVar42,auVar78,auVar61);
        auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar73 = ZEXT1664(auVar59);
        auVar62 = vaddps_avx512vl(auVar45,auVar62);
        auVar42 = vaddps_avx512vl(auVar46,auVar57);
        auVar57 = vaddps_avx512vl(auVar54,auVar58);
        auVar58 = vmulps_avx512vl(auVar42,auVar52);
        auVar58 = vfmsub231ps_avx512vl(auVar58,auVar51,auVar57);
        auVar57 = vmulps_avx512vl(auVar57,auVar49);
        auVar57 = vfmsub231ps_avx512vl(auVar57,auVar52,auVar62);
        auVar45._0_4_ = auVar62._0_4_ * auVar51._0_4_;
        auVar45._4_4_ = auVar62._4_4_ * auVar51._4_4_;
        auVar45._8_4_ = auVar62._8_4_ * auVar51._8_4_;
        auVar45._12_4_ = auVar62._12_4_ * auVar51._12_4_;
        auVar62 = vfmsub231ps_avx512vl(auVar45,auVar49,auVar42);
        auVar62 = vmulps_avx512vl(auVar62,auVar83);
        auVar62 = vfmadd231ps_avx512vl(auVar62,auVar79,auVar57);
        auVar57 = vfmadd231ps_avx512vl(auVar62,auVar78,auVar58);
        auVar58._0_4_ = local_2578._0_4_ + local_2588._0_4_;
        auVar58._4_4_ = local_2578._4_4_ + local_2588._4_4_;
        auVar58._8_4_ = local_2578._8_4_ + local_2588._8_4_;
        auVar58._12_4_ = local_2578._12_4_ + local_2588._12_4_;
        local_2568 = vaddps_avx512vl(auVar57,auVar58);
        auVar62._8_4_ = 0x7fffffff;
        auVar62._0_8_ = 0x7fffffff7fffffff;
        auVar62._12_4_ = 0x7fffffff;
        auVar62 = vandps_avx512vl(local_2568,auVar62);
        auVar42._8_4_ = 0x34000000;
        auVar42._0_8_ = 0x3400000034000000;
        auVar42._12_4_ = 0x34000000;
        auVar42 = vmulps_avx512vl(auVar62,auVar42);
        auVar58 = vminps_avx512vl(local_2588,local_2578);
        auVar58 = vminps_avx512vl(auVar58,auVar57);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar45 = vxorps_avx512vl(auVar42,auVar45);
        uVar17 = vcmpps_avx512vl(auVar58,auVar45,5);
        auVar58 = vmaxps_avx512vl(local_2588,local_2578);
        auVar57 = vmaxps_avx512vl(auVar58,auVar57);
        uVar16 = vcmpps_avx512vl(auVar57,auVar42,2);
        local_2550 = ((byte)uVar17 | (byte)uVar16) & 0xf;
        if (local_2550 != 0) {
          auVar42 = vmulps_avx512vl(auVar50,auVar55);
          auVar57 = vmulps_avx512vl(auVar63,auVar48);
          auVar58 = vmulps_avx512vl(auVar47,auVar56);
          auVar45 = vmulps_avx512vl(auVar51,auVar48);
          auVar54 = vmulps_avx512vl(auVar47,auVar52);
          auVar46 = vmulps_avx512vl(auVar49,auVar50);
          auVar56 = vfmsub213ps_avx512vl(auVar56,auVar48,auVar42);
          auVar55 = vfmsub213ps_avx512vl(auVar55,auVar47,auVar57);
          auVar63 = vfmsub213ps_avx512vl(auVar63,auVar50,auVar58);
          auVar50 = vfmsub213ps_avx512vl(auVar52,auVar50,auVar45);
          auVar48 = vfmsub213ps_avx512vl(auVar49,auVar48,auVar54);
          auVar47 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar46);
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar42 = vandps_avx512vl(auVar42,auVar49);
          auVar45 = vandps_avx512vl(auVar45,auVar49);
          uVar30 = vcmpps_avx512vl(auVar42,auVar45,1);
          auVar42 = vandps_avx512vl(auVar57,auVar49);
          auVar57 = vandps_avx512vl(auVar54,auVar49);
          uVar41 = vcmpps_avx512vl(auVar42,auVar57,1);
          auVar42 = vandps_avx512vl(auVar58,auVar49);
          auVar57 = vandps_avx512vl(auVar46,auVar49);
          uVar32 = vcmpps_avx512vl(auVar42,auVar57,1);
          bVar13 = (bool)((byte)uVar30 & 1);
          local_2518._0_4_ = (uint)bVar13 * auVar56._0_4_ | (uint)!bVar13 * auVar50._0_4_;
          bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
          local_2518._4_4_ = (uint)bVar13 * auVar56._4_4_ | (uint)!bVar13 * auVar50._4_4_;
          bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
          local_2518._8_4_ = (uint)bVar13 * auVar56._8_4_ | (uint)!bVar13 * auVar50._8_4_;
          bVar13 = (bool)((byte)(uVar30 >> 3) & 1);
          local_2518._12_4_ = (uint)bVar13 * auVar56._12_4_ | (uint)!bVar13 * auVar50._12_4_;
          bVar13 = (bool)((byte)uVar41 & 1);
          local_2508._0_4_ = (uint)bVar13 * auVar55._0_4_ | (uint)!bVar13 * auVar48._0_4_;
          bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
          local_2508._4_4_ = (uint)bVar13 * auVar55._4_4_ | (uint)!bVar13 * auVar48._4_4_;
          bVar13 = (bool)((byte)(uVar41 >> 2) & 1);
          local_2508._8_4_ = (uint)bVar13 * auVar55._8_4_ | (uint)!bVar13 * auVar48._8_4_;
          bVar13 = (bool)((byte)(uVar41 >> 3) & 1);
          local_2508._12_4_ = (uint)bVar13 * auVar55._12_4_ | (uint)!bVar13 * auVar48._12_4_;
          bVar13 = (bool)((byte)uVar32 & 1);
          local_24f8[0] = (float)((uint)bVar13 * auVar63._0_4_ | (uint)!bVar13 * auVar47._0_4_);
          bVar13 = (bool)((byte)(uVar32 >> 1) & 1);
          local_24f8[1] = (float)((uint)bVar13 * auVar63._4_4_ | (uint)!bVar13 * auVar47._4_4_);
          bVar13 = (bool)((byte)(uVar32 >> 2) & 1);
          local_24f8[2] = (float)((uint)bVar13 * auVar63._8_4_ | (uint)!bVar13 * auVar47._8_4_);
          bVar13 = (bool)((byte)(uVar32 >> 3) & 1);
          local_24f8[3] = (float)((uint)bVar13 * auVar63._12_4_ | (uint)!bVar13 * auVar47._12_4_);
          auVar55._0_4_ = fVar2 * local_24f8[0];
          auVar55._4_4_ = fVar2 * local_24f8[1];
          auVar55._8_4_ = fVar2 * local_24f8[2];
          auVar55._12_4_ = fVar2 * local_24f8[3];
          auVar63 = vfmadd213ps_fma(auVar79,local_2508,auVar55);
          auVar63 = vfmadd213ps_fma(auVar78,local_2518,auVar63);
          auVar56._0_4_ = auVar63._0_4_ + auVar63._0_4_;
          auVar56._4_4_ = auVar63._4_4_ + auVar63._4_4_;
          auVar56._8_4_ = auVar63._8_4_ + auVar63._8_4_;
          auVar56._12_4_ = auVar63._12_4_ + auVar63._12_4_;
          auVar54._0_4_ = auVar43._0_4_ * local_24f8[0];
          auVar54._4_4_ = auVar43._4_4_ * local_24f8[1];
          auVar54._8_4_ = auVar43._8_4_ * local_24f8[2];
          auVar54._12_4_ = auVar43._12_4_ * local_24f8[3];
          auVar63 = vfmadd213ps_fma(auVar44,local_2508,auVar54);
          auVar63 = vfmadd213ps_fma(auVar53,local_2518,auVar63);
          auVar42 = vrcp14ps_avx512vl(auVar56);
          auVar53._8_4_ = 0x3f800000;
          auVar53._0_8_ = &DAT_3f8000003f800000;
          auVar53._12_4_ = 0x3f800000;
          auVar53 = vfnmadd213ps_avx512vl(auVar42,auVar56,auVar53);
          auVar53 = vfmadd132ps_fma(auVar53,auVar42,auVar42);
          local_2528._0_4_ = (auVar63._0_4_ + auVar63._0_4_) * auVar53._0_4_;
          local_2528._4_4_ = (auVar63._4_4_ + auVar63._4_4_) * auVar53._4_4_;
          local_2528._8_4_ = (auVar63._8_4_ + auVar63._8_4_) * auVar53._8_4_;
          local_2528._12_4_ = (auVar63._12_4_ + auVar63._12_4_) * auVar53._12_4_;
          auVar80 = ZEXT1664(local_2528);
          uVar5 = *(undefined4 *)(local_2688 + k * 4 + 0x80);
          auVar63._4_4_ = uVar5;
          auVar63._0_4_ = uVar5;
          auVar63._8_4_ = uVar5;
          auVar63._12_4_ = uVar5;
          uVar17 = vcmpps_avx512vl(local_2528,auVar63,2);
          uVar5 = *(undefined4 *)(local_2688 + k * 4 + 0x30);
          auVar57._4_4_ = uVar5;
          auVar57._0_4_ = uVar5;
          auVar57._8_4_ = uVar5;
          auVar57._12_4_ = uVar5;
          uVar16 = vcmpps_avx512vl(local_2528,auVar57,0xd);
          local_2550 = (byte)uVar17 & (byte)uVar16 & local_2550;
          if (local_2550 != 0) {
            uVar17 = vcmpps_avx512vl(auVar56,_DAT_01feba10,4);
            local_2550 = local_2550 & (byte)uVar17;
            uVar40 = (uint)local_2550;
            if (local_2550 != 0) {
              auVar43._8_4_ = 0x219392ef;
              auVar43._0_8_ = 0x219392ef219392ef;
              auVar43._12_4_ = 0x219392ef;
              uVar30 = vcmpps_avx512vl(auVar62,auVar43,5);
              auVar62 = vrcp14ps_avx512vl(local_2568);
              auVar48._8_4_ = 0x3f800000;
              auVar48._0_8_ = &DAT_3f8000003f800000;
              auVar48._12_4_ = 0x3f800000;
              auVar53 = vfnmadd213ps_fma(local_2568,auVar62,auVar48);
              auVar53 = vfmadd132ps_avx512vl(auVar53,auVar62,auVar62);
              fVar14 = (float)((uint)((byte)uVar30 & 1) * auVar53._0_4_);
              fVar4 = (float)((uint)((byte)(uVar30 >> 1) & 1) * auVar53._4_4_);
              fVar3 = (float)((uint)((byte)(uVar30 >> 2) & 1) * auVar53._8_4_);
              fVar2 = (float)((uint)((byte)(uVar30 >> 3) & 1) * auVar53._12_4_);
              auVar46._0_4_ = fVar14 * local_2588._0_4_;
              auVar46._4_4_ = fVar4 * local_2588._4_4_;
              auVar46._8_4_ = fVar3 * local_2588._8_4_;
              auVar46._12_4_ = fVar2 * local_2588._12_4_;
              local_2548 = vminps_avx(auVar46,auVar48);
              auVar50._0_4_ = fVar14 * local_2578._0_4_;
              auVar50._4_4_ = fVar4 * local_2578._4_4_;
              auVar50._8_4_ = fVar3 * local_2578._8_4_;
              auVar50._12_4_ = fVar2 * local_2578._12_4_;
              local_2538 = vminps_avx(auVar50,auVar48);
              auVar53 = vblendmps_avx512vl(auVar59,local_2528);
              auVar44._0_4_ =
                   (uint)(local_2550 & 1) * auVar53._0_4_ |
                   (uint)!(bool)(local_2550 & 1) * local_2538._0_4_;
              bVar13 = (bool)(local_2550 >> 1 & 1);
              auVar44._4_4_ = (uint)bVar13 * auVar53._4_4_ | (uint)!bVar13 * local_2538._4_4_;
              bVar13 = (bool)(local_2550 >> 2 & 1);
              auVar44._8_4_ = (uint)bVar13 * auVar53._8_4_ | (uint)!bVar13 * local_2538._8_4_;
              auVar44._12_4_ =
                   (uint)(local_2550 >> 3) * auVar53._12_4_ |
                   (uint)!(bool)(local_2550 >> 3) * local_2538._12_4_;
              auVar53 = vshufps_avx(auVar44,auVar44,0xb1);
              auVar53 = vminps_avx(auVar53,auVar44);
              auVar62 = vshufpd_avx(auVar53,auVar53,1);
              auVar53 = vminps_avx(auVar62,auVar53);
              uVar17 = vcmpps_avx512vl(auVar44,auVar53,0);
              bVar26 = (byte)uVar17 & local_2550;
              if (((byte)uVar17 & local_2550) == 0) {
                bVar26 = local_2550;
              }
              uVar30 = 0;
              for (uVar41 = (ulong)bVar26; local_2678 = pSVar8, (uVar41 & 1) == 0;
                  uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                uVar30 = uVar30 + 1;
              }
              do {
                uVar7 = *(uint *)((long)&local_24d8 + uVar30 * 4);
                pGVar9 = (pSVar8->geometries).items[uVar7].ptr;
                auVar53 = auVar44;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar26 = ~(byte)(1 << ((uint)uVar30 & 0x1f)) & (byte)uVar40;
LAB_0084358a:
                  uVar40 = (uint)bVar26;
                  bVar13 = true;
                }
                else {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    uVar5 = *(undefined4 *)(local_2548 + uVar30 * 4);
                    local_2498._4_4_ = uVar5;
                    local_2498._0_4_ = uVar5;
                    local_2498._8_4_ = uVar5;
                    local_2498._12_4_ = uVar5;
                    local_2488 = *(undefined4 *)(local_2538 + uVar30 * 4);
                    local_2468 = vpbroadcastd_avx512vl();
                    uVar5 = *(undefined4 *)((long)&local_2638 + uVar30 * 4);
                    local_2478._4_4_ = uVar5;
                    local_2478._0_4_ = uVar5;
                    local_2478._8_4_ = uVar5;
                    local_2478._12_4_ = uVar5;
                    uVar5 = *(undefined4 *)(local_2518 + uVar30 * 4);
                    fVar2 = local_24f8[uVar30 - 4];
                    local_24b8._4_4_ = fVar2;
                    local_24b8._0_4_ = fVar2;
                    local_24b8._8_4_ = fVar2;
                    local_24b8._12_4_ = fVar2;
                    fVar2 = local_24f8[uVar30];
                    local_24a8._4_4_ = fVar2;
                    local_24a8._0_4_ = fVar2;
                    local_24a8._8_4_ = fVar2;
                    local_24a8._12_4_ = fVar2;
                    local_24c8[0] = (RTCHitN)(char)uVar5;
                    local_24c8[1] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_24c8[2] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_24c8[3] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_24c8[4] = (RTCHitN)(char)uVar5;
                    local_24c8[5] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_24c8[6] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_24c8[7] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_24c8[8] = (RTCHitN)(char)uVar5;
                    local_24c8[9] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_24c8[10] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_24c8[0xb] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_24c8[0xc] = (RTCHitN)(char)uVar5;
                    local_24c8[0xd] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_24c8[0xe] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_24c8[0xf] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    uStack_2484 = local_2488;
                    uStack_2480 = local_2488;
                    uStack_247c = local_2488;
                    vpcmpeqd_avx2(ZEXT1632(local_2498),ZEXT1632(local_2498));
                    uStack_2454 = context->user->instID[0];
                    local_2458 = uStack_2454;
                    uStack_2450 = uStack_2454;
                    uStack_244c = uStack_2454;
                    uStack_2448 = context->user->instPrimID[0];
                    uStack_2444 = uStack_2448;
                    uStack_2440 = uStack_2448;
                    uStack_243c = uStack_2448;
                    uVar19 = *(uint *)(ray + k * 4 + 0x80);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2528 + uVar30 * 4);
                    local_26d8 = local_24e8._0_8_;
                    uStack_26d0 = local_24e8._8_8_;
                    args.valid = (int *)&local_26d8;
                    args.geometryUserPtr = pGVar9->userPtr;
                    args.context = context->user;
                    args.ray = (RTCRayN *)ray;
                    args.hit = local_24c8;
                    args.N = 4;
                    auVar53 = auVar80._0_16_;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar9->intersectionFilterN)(&args);
                      auVar80 = ZEXT1664(auVar53);
                      auVar94 = ZEXT3264(local_2628);
                      auVar93 = ZEXT3264(local_2608);
                      auVar92 = ZEXT3264(local_25e8);
                      auVar91 = ZEXT3264(local_25c8);
                      auVar90 = ZEXT3264(local_25a8);
                    }
                    auVar49._8_8_ = uStack_26d0;
                    auVar49._0_8_ = local_26d8;
                    uVar41 = vptestmd_avx512vl(auVar49,auVar49);
                    if ((uVar41 & 0xf) == 0) {
LAB_00843874:
                      auVar53 = ZEXT416(uVar19);
                      *(uint *)(ray + k * 4 + 0x80) = uVar19;
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var10)(&args);
                        auVar80 = ZEXT1664(auVar53);
                        auVar94 = ZEXT3264(local_2628);
                        auVar93 = ZEXT3264(local_2608);
                        auVar92 = ZEXT3264(local_25e8);
                        auVar91 = ZEXT3264(local_25c8);
                        auVar90 = ZEXT3264(local_25a8);
                      }
                      auVar51._8_8_ = uStack_26d0;
                      auVar51._0_8_ = local_26d8;
                      uVar41 = vptestmd_avx512vl(auVar51,auVar51);
                      uVar41 = uVar41 & 0xf;
                      bVar26 = (byte)uVar41;
                      if (bVar26 == 0) goto LAB_00843874;
                      iVar23 = *(int *)(args.hit + 4);
                      iVar20 = *(int *)(args.hit + 8);
                      iVar21 = *(int *)(args.hit + 0xc);
                      bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar12 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar26 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar11 * iVar20 | (uint)!bVar11 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar12 * iVar21 | (uint)!bVar12 * *(int *)(args.ray + 0xcc);
                      iVar23 = *(int *)(args.hit + 0x14);
                      iVar20 = *(int *)(args.hit + 0x18);
                      iVar21 = *(int *)(args.hit + 0x1c);
                      bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar12 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar26 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar11 * iVar20 | (uint)!bVar11 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar12 * iVar21 | (uint)!bVar12 * *(int *)(args.ray + 0xdc);
                      iVar23 = *(int *)(args.hit + 0x24);
                      iVar20 = *(int *)(args.hit + 0x28);
                      iVar21 = *(int *)(args.hit + 0x2c);
                      bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar12 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar26 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar11 * iVar20 | (uint)!bVar11 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar12 * iVar21 | (uint)!bVar12 * *(int *)(args.ray + 0xec);
                      iVar23 = *(int *)(args.hit + 0x34);
                      iVar20 = *(int *)(args.hit + 0x38);
                      iVar21 = *(int *)(args.hit + 0x3c);
                      bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar12 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar26 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar11 * iVar20 | (uint)!bVar11 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar12 * iVar21 | (uint)!bVar12 * *(int *)(args.ray + 0xfc);
                      iVar23 = *(int *)(args.hit + 0x44);
                      iVar20 = *(int *)(args.hit + 0x48);
                      iVar21 = *(int *)(args.hit + 0x4c);
                      bVar13 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar12 = SUB81(uVar41 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar26 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar11 * iVar20 | (uint)!bVar11 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar12 * iVar21 | (uint)!bVar12 * *(int *)(args.ray + 0x10c);
                      auVar53 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar53;
                      auVar53 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar53;
                      auVar53 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar53;
                      auVar53 = *(undefined1 (*) [16])(args.hit + 0x80);
                      auVar62 = vmovdqa32_avx512vl(auVar53);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar62;
                    }
                    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar73 = ZEXT1664(auVar62);
                    uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar52._4_4_ = uVar5;
                    auVar52._0_4_ = uVar5;
                    auVar52._8_4_ = uVar5;
                    auVar52._12_4_ = uVar5;
                    uVar17 = vcmpps_avx512vl(auVar80._0_16_,auVar52,2);
                    bVar26 = ~(byte)(1 << ((uint)uVar30 & 0x1f)) & (byte)uVar40 & (byte)uVar17;
                    goto LAB_0084358a;
                  }
                  bVar13 = false;
                }
                if (!bVar13) {
                  uVar5 = *(undefined4 *)(local_2548 + uVar30 * 4);
                  uVar6 = *(undefined4 *)(local_2538 + uVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2528 + uVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2518 + uVar30 * 4);
                  *(float *)(ray + k * 4 + 0xd0) = local_24f8[uVar30 - 4];
                  *(float *)(ray + k * 4 + 0xe0) = local_24f8[uVar30];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_2638 + uVar30 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar7;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                bVar26 = (byte)uVar40;
                if (bVar26 == 0) break;
                auVar62 = vblendmps_avx512vl(auVar73._0_16_,auVar80._0_16_);
                auVar44._0_4_ =
                     (uint)(bVar26 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar53._0_4_;
                bVar13 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar13 * auVar62._4_4_ | (uint)!bVar13 * auVar53._4_4_;
                bVar13 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar13 * auVar62._8_4_ | (uint)!bVar13 * auVar53._8_4_;
                auVar44._12_4_ =
                     (uVar40 >> 3) * auVar62._12_4_ | (uint)!SUB41(uVar40 >> 3,0) * auVar53._12_4_;
                auVar53 = vshufps_avx(auVar44,auVar44,0xb1);
                auVar53 = vminps_avx(auVar53,auVar44);
                auVar62 = vshufpd_avx(auVar53,auVar53,1);
                auVar53 = vminps_avx(auVar62,auVar53);
                uVar17 = vcmpps_avx512vl(auVar44,auVar53,0);
                bVar26 = (byte)uVar17 & bVar26;
                uVar7 = uVar40;
                if (bVar26 != 0) {
                  uVar7 = (uint)bVar26;
                }
                uVar19 = 0;
                for (; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
                  uVar19 = uVar19 + 1;
                }
                uVar30 = (ulong)uVar19;
              } while( true );
            }
          }
        }
        local_2670 = local_2670 + 1;
        pRVar39 = ray;
      } while (local_2670 != local_2680);
    }
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar73 = ZEXT3264(CONCAT428(uVar5,CONCAT424(uVar5,CONCAT420(uVar5,CONCAT416(uVar5,CONCAT412(
                                                  uVar5,CONCAT48(uVar5,CONCAT44(uVar5,uVar5))))))));
    auVar80 = ZEXT3264(local_23b8);
    auVar82 = ZEXT3264(local_23d8);
    auVar84 = ZEXT3264(local_23f8);
    auVar85 = ZEXT3264(local_2418);
    auVar86 = ZEXT3264(local_2438);
    auVar72 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar87 = ZEXT3264(auVar72);
    auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    auVar72 = vmovdqu64_avx512vl(local_2398);
    in_ZMM16 = ZEXT3264(auVar72);
    uVar31 = local_26b8;
    unaff_RBP = local_2698;
    uVar30 = local_26a0;
    uVar41 = local_26a8;
    uVar32 = local_26b0;
    uVar33 = local_26c8;
    uVar34 = local_26c0;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }